

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportPdu.cpp
# Opt level: O2

void __thiscall DIS::EventReportPdu::marshal(EventReportPdu *this,DataStream *dataStream)

{
  pointer pFVar1;
  pointer pVVar2;
  ulong uVar3;
  long lVar4;
  FixedDatum x;
  
  SimulationManagementFamilyPdu::marshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,this->_eventType);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatums).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatums).
                                 super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (uint)(((long)(this->_variableDatums).
                           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_variableDatums).
                          super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  lVar4 = 8;
  for (uVar3 = 0;
      pFVar1 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_fixedDatums).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar3 = uVar3 + 1) {
    x._vptr_FixedDatum = (_func_int **)&PTR__FixedDatum_001c1c68;
    x._8_8_ = *(undefined8 *)((long)&pFVar1->_vptr_FixedDatum + lVar4);
    FixedDatum::marshal(&x,dataStream);
    FixedDatum::~FixedDatum(&x);
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (uVar3 = 0;
      pVVar2 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->_variableDatums).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar3 = uVar3 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&x,(VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar4));
    VariableDatum::marshal((VariableDatum *)&x,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)&x);
    lVar4 = lVar4 + 0x30;
  }
  return;
}

Assistant:

void EventReportPdu::marshal(DataStream& dataStream) const
{
    SimulationManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _eventType;
    dataStream << _padding1;
    dataStream << ( unsigned int )_fixedDatums.size();
    dataStream << ( unsigned int )_variableDatums.size();

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        FixedDatum x = _fixedDatums[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        VariableDatum x = _variableDatums[idx];
        x.marshal(dataStream);
     }

}